

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.h
# Opt level: O0

bool __thiscall
dg::vr::ValueRelations::PlainValueIterator::nextViableValue(PlainValueIterator *this)

{
  bool bVar1;
  __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
  *__lhs;
  _Self *__x;
  const_iterator cVar2;
  long in_RDI;
  VectorSet<const_llvm::Value_*> *in_stack_ffffffffffffffc8;
  
  while( true ) {
    __lhs = (__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
             *)(in_RDI + 0x10);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>
                  *)0x20b9c9);
    VectorSet<const_llvm::Value_*>::end(in_stack_ffffffffffffffc8);
    bVar1 = __gnu_cxx::operator==
                      (__lhs,(__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                              *)in_stack_ffffffffffffffc8);
    if (!bVar1) {
      return true;
    }
    __x = std::
          _Rb_tree_const_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>
          ::operator++((_Rb_tree_const_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>
                        *)__lhs);
    bVar1 = std::operator==(__x,(_Self *)(in_RDI + 8));
    if (bVar1) break;
    std::
    _Rb_tree_const_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>
                  *)0x20ba21);
    cVar2 = VectorSet<const_llvm::Value_*>::begin(in_stack_ffffffffffffffc8);
    *(Value ***)(in_RDI + 0x10) = cVar2._M_current;
  }
  return false;
}

Assistant:

bool nextViableValue() {
            while (valueIt == bucketIt->second.end()) {
                if (++bucketIt == endIt)
                    return false;
                valueIt = bucketIt->second.begin();
            }
            return true;
        }